

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accumulate.cc
# Opt level: O2

void do_weighting<dense_parameters>
               (vw *all,uint64_t length,float *param_3,dense_parameters *weights)

{
  uint64_t i;
  uint64_t uVar1;
  float *pfVar2;
  float fVar3;
  
  for (uVar1 = 0; length != uVar1; uVar1 = uVar1 + 1) {
    pfVar2 = weights->_begin +
             (uVar1 << ((byte)weights->_stride_shift & 0x3f) & weights->_weight_mask);
    if (param_3[uVar1] <= 0.0) {
      param_3[uVar1] = 0.0;
      *pfVar2 = 0.0;
    }
    else {
      fVar3 = pfVar2[1] / param_3[uVar1];
      param_3[uVar1] = *pfVar2 * fVar3;
      *(ulong *)pfVar2 =
           CONCAT44(fVar3 * (float)((ulong)*(undefined8 *)pfVar2 >> 0x20),
                    fVar3 * (float)*(undefined8 *)pfVar2);
      if (all->normalized_updates == true) {
        pfVar2[all->normalized_idx] = fVar3 * pfVar2[all->normalized_idx];
      }
    }
  }
  return;
}

Assistant:

void do_weighting(vw& all, uint64_t length, float* local_weights, T& weights)
{
  for (uint64_t i = 0; i < length; i++)
  {
    float* weight = &weights[i << weights.stride_shift()];
    if (local_weights[i] > 0)
    {
      float ratio = weight[1] / local_weights[i];
      local_weights[i] = weight[0] * ratio;
      weight[0] *= ratio;
      weight[1] *= ratio;  // A crude max
      if (all.normalized_updates)
        weight[all.normalized_idx] *= ratio;  // A crude max
    }
    else
    {
      local_weights[i] = 0;
      *weight = 0;
    }
  }
}